

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

void Luv32toLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  uint uVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  
  puVar2 = (uint *)sp->tbuf;
  while (0 < n) {
    n = n + -1;
    uVar1 = *puVar2;
    *(short *)op = (short)(uVar1 >> 0x10);
    uVar4 = CONCAT44(uVar1,uVar1 >> 8) & 0xff000000ff;
    auVar3._0_4_ = (int)(((double)(int)uVar4 + 0.5) * 0.0024390243902439024 * 32768.0);
    auVar3._4_4_ = (int)(((double)(int)(uVar4 >> 0x20) + 0.5) * 0.0024390243902439024 * 32768.0);
    auVar3._8_8_ = 0;
    auVar3 = pshuflw(auVar3,auVar3,0xe8);
    *(int *)(op + 2) = auVar3._0_4_;
    puVar2 = puVar2 + 1;
    op = op + 6;
  }
  return;
}

Assistant:

static void Luv32toLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    while (n-- > 0)
    {
        double u, v;

        *luv3++ = (int16_t)(*luv >> 16);
        u = 1. / UVSCALE * ((*luv >> 8 & 0xff) + .5);
        v = 1. / UVSCALE * ((*luv & 0xff) + .5);
        *luv3++ = (int16_t)(u * (1L << 15));
        *luv3++ = (int16_t)(v * (1L << 15));
        luv++;
    }
}